

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setGeometry(QWidget *this,QRect *r)

{
  long lVar1;
  bool bVar2;
  QWidgetPrivate *this_00;
  QTLWExtra *pQVar3;
  QSize *this_01;
  QSize QVar4;
  QSize this_02;
  pointer pQVar5;
  long in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  QRect oldRect;
  int in_stack_000000e8;
  int in_stack_000000ec;
  QRect *in_stack_ffffffffffffff68;
  QWidgetPrivate *in_stack_ffffffffffffff70;
  QWidget *in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 isMove;
  undefined8 in_stack_ffffffffffffffc8;
  QWidgetPrivate *in_stack_ffffffffffffffd0;
  QWidget *in_stack_ffffffffffffffd8;
  
  isMove = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWidget *)0x375e85);
  setAttribute(in_stack_ffffffffffffffd8,(WidgetAttribute)((ulong)in_stack_ffffffffffffffd0 >> 0x20)
               ,SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x18,0));
  setAttribute(in_stack_ffffffffffffffd8,(WidgetAttribute)((ulong)in_stack_ffffffffffffffd0 >> 0x20)
               ,SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x18,0));
  bVar2 = isWindow((QWidget *)in_stack_ffffffffffffff70);
  if (bVar2) {
    pQVar3 = QWidgetPrivate::topData(in_stack_ffffffffffffff70);
    *(ushort *)&pQVar3->field_0xe0 = *(ushort *)&pQVar3->field_0xe0 & 0xfeff;
  }
  bVar2 = testAttribute(in_stack_ffffffffffffff78,
                        (WidgetAttribute)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  if (bVar2) {
    QRect::x((QRect *)0x375f0c);
    QRect::y((QRect *)0x375f1a);
    QRect::width(in_stack_ffffffffffffff68);
    QRect::height(in_stack_ffffffffffffff68);
    QWidgetPrivate::setGeometry_sys
              (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               (int)in_stack_ffffffffffffffc8,in_stack_000000ec,in_stack_000000e8,(bool)isMove);
    QWidgetPrivate::setDirtyOpaqueRegion(this_00);
  }
  else {
    in_stack_ffffffffffffff70 = (QWidgetPrivate *)(*(long *)(in_RDI + 0x20) + 0x14);
    QRect::topLeft(in_stack_ffffffffffffff68);
    QRect::setTopLeft((QRect *)in_stack_ffffffffffffff80,(QPoint *)in_stack_ffffffffffffff78);
    this_01 = (QSize *)(*(long *)(in_RDI + 0x20) + 0x14);
    QRect::size((QRect *)in_stack_ffffffffffffff80);
    maximumSize(in_stack_ffffffffffffff80);
    QVar4 = QSize::boundedTo(this_01,(QSize *)in_stack_ffffffffffffff70);
    minimumSize(in_stack_ffffffffffffff80);
    this_02 = QSize::expandedTo(this_01,(QSize *)in_stack_ffffffffffffff70);
    QRect::setSize((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (QSize *)in_stack_ffffffffffffff80);
    bVar2 = ::operator!=((QRect *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar2) {
      setAttribute((QWidget *)this_02,QVar4.ht.m_i.m_i,QVar4.wd.m_i._3_1_);
      setAttribute((QWidget *)this_02,QVar4.ht.m_i.m_i,QVar4.wd.m_i._3_1_);
    }
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x37609c);
  if ((bVar2) &&
     (pQVar5 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3760b0),
     (*(ushort *)&pQVar5->field_0x7c >> 8 & 1) != 0)) {
    QWindowContainer::parentWasMoved((QWidget *)in_stack_ffffffffffffff70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setGeometry(const QRect &r)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_Resized);
    setAttribute(Qt::WA_Moved);
    if (isWindow())
        d->topData()->posIncludesFrame = 0;
    if (testAttribute(Qt::WA_WState_Created)) {
        d->setGeometry_sys(r.x(), r.y(), r.width(), r.height(), true);
        d->setDirtyOpaqueRegion();
    } else {
        const auto oldRect = data->crect;
        data->crect.setTopLeft(r.topLeft());
        data->crect.setSize(r.size().boundedTo(maximumSize()).expandedTo(minimumSize()));
        if (oldRect != data->crect) {
            setAttribute(Qt::WA_PendingMoveEvent);
            setAttribute(Qt::WA_PendingResizeEvent);
        }
    }

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasMoved(this);
}